

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.cpp
# Opt level: O0

Token __thiscall
slang::parsing::NumberParser::finishValue
          (NumberParser *this,Token firstToken,bool singleToken,bool isNegated)

{
  SourceLocation location;
  span<const_slang::logic_t,_18446744073709551615UL> digits;
  span<const_slang::logic_t,_18446744073709551615UL> digits_00;
  bool bVar1;
  byte bVar2;
  uint uVar3;
  size_type sVar4;
  reference this_00;
  uint *puVar5;
  byte in_CL;
  uint uVar6;
  __extent_storage<18446744073709551615UL> in_RDX;
  pointer in_RSI;
  uint *in_RDI;
  byte in_R8B;
  Token TVar7;
  SVInt result_1;
  bitwidth_t bits;
  uint32_t multiplier;
  SVInt result;
  bitwidth_t width;
  anon_class_16_2_3c4fafbd checkOverflow;
  anon_class_24_3_421b894d createResult;
  logic_t *in_stack_fffffffffffffe58;
  NumberParser *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  DiagCode in_stack_fffffffffffffe74;
  undefined4 in_stack_fffffffffffffe78;
  bitwidth_t in_stack_fffffffffffffe7c;
  anon_class_16_2_3c4fafbd *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  anon_class_24_3_421b894d *in_stack_fffffffffffffec0;
  anon_class_24_3_421b894d *this_01;
  anon_class_24_3_421b894d *in_stack_fffffffffffffef0;
  undefined1 in_stack_ffffffffffffff31;
  undefined1 in_stack_ffffffffffffff32;
  LiteralBase in_stack_ffffffffffffff33;
  bitwidth_t in_stack_ffffffffffffff34;
  uint local_bc;
  int local_b8;
  logic_t local_b1 [49];
  SVInt local_80 [2];
  bitwidth_t local_60;
  undefined4 local_5c;
  byte *local_58;
  undefined1 *local_40;
  byte *local_38;
  byte local_2a;
  byte local_29 [9];
  Token local_10;
  
  local_29[0] = in_CL & 1;
  local_2a = in_R8B & 1;
  local_40 = &stack0xffffffffffffffe0;
  local_38 = local_29;
  local_58 = &local_2a;
  if ((*(byte *)((long)in_RDI + 0x1a) & 1) == 0) {
    local_5c = 0;
    local_10 = finishValue(slang::parsing::Token,bool,bool)::$_0::operator()
                         (in_stack_fffffffffffffef0,(int *)in_RDI);
  }
  else if (((char)in_RDI[1] == '\x02') && ((*(byte *)((long)in_RDI + 0x19) & 1) == 0)) {
    local_60 = SVInt::getBitWidth((SVInt *)(in_RDI + 8));
    if ((in_RDI[6] & 1) != 0) {
      local_60 = local_60 + 1;
      SVInt::resize((SVInt *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                    (bitwidth_t)in_stack_fffffffffffffe74);
      SVInt::operator=((SVInt *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                       (SVInt *)in_stack_fffffffffffffe60);
      SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    }
    SVInt::SVInt((SVInt *)0xa8fee0);
    if (*in_RDI == 0) {
      if (local_60 < 0x20) {
        SVInt::resize((SVInt *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                      (bitwidth_t)in_stack_fffffffffffffe74);
        SVInt::operator=((SVInt *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                         (SVInt *)in_stack_fffffffffffffe60);
        SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      }
      else {
        SVInt::operator=((SVInt *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                         (SVInt *)in_stack_fffffffffffffe60);
      }
    }
    else if (local_60 == *in_RDI) {
      SVInt::operator=((SVInt *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                       (SVInt *)in_stack_fffffffffffffe60);
    }
    else {
      SVInt::resize((SVInt *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                    (bitwidth_t)in_stack_fffffffffffffe74);
      SVInt::operator=((SVInt *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                       (SVInt *)in_stack_fffffffffffffe60);
      SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      if (*in_RDI < local_60) {
        finishValue::anon_class_16_2_3c4fafbd::operator()
                  (in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                   (SVInt *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      }
    }
    SVInt::setSigned(local_80,(bool)((byte)in_RDI[6] & 1));
    local_10 = finishValue(slang::parsing::Token,bool,bool)::$_0::operator()
                         (in_stack_fffffffffffffec0,
                          (SVInt *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  }
  else {
    bVar1 = SmallVectorBase<slang::logic_t>::empty
                      ((SmallVectorBase<slang::logic_t> *)(in_RDI + 0x10));
    if (bVar1) {
      logic_t::logic_t(local_b1,'\0');
      SmallVectorBase<slang::logic_t>::push_back
                ((SmallVectorBase<slang::logic_t> *)in_stack_fffffffffffffe60,
                 in_stack_fffffffffffffe58);
    }
    else if ((char)in_RDI[1] != '\x02') {
      if ((char)in_RDI[1] == '\0') {
        local_b8 = 1;
      }
      else if ((char)in_RDI[1] == '\x01') {
        local_b8 = 3;
      }
      else {
        local_b8 = 4;
      }
      local_bc = 0;
      sVar4 = SmallVectorBase<slang::logic_t>::size
                        ((SmallVectorBase<slang::logic_t> *)(in_RDI + 0x10));
      if (1 < sVar4) {
        sVar4 = SmallVectorBase<slang::logic_t>::size
                          ((SmallVectorBase<slang::logic_t> *)(in_RDI + 0x10));
        local_bc = ((int)sVar4 + -1) * local_b8;
      }
      this_00 = SmallVectorBase<slang::logic_t>::operator[]
                          ((SmallVectorBase<slang::logic_t> *)(in_RDI + 0x10),0);
      bVar1 = logic_t::isUnknown(this_00);
      if (!bVar1) {
        SmallVectorBase<slang::logic_t>::operator[]
                  ((SmallVectorBase<slang::logic_t> *)(in_RDI + 0x10),0);
        bVar2 = std::bit_width<unsigned_char>('\0');
        local_bc = bVar2 + local_bc;
      }
      if (*in_RDI < local_bc) {
        if (*in_RDI != 0) {
          uVar3 = *in_RDI;
          uVar6 = (uint)(byte)in_RDI[1];
          std::span<const_slang::logic_t,_18446744073709551615UL>::
          span<slang::SmallVector<slang::logic_t,_40UL>_&>
                    ((span<const_slang::logic_t,_18446744073709551615UL> *)
                     CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                     (SmallVector<slang::logic_t,_40UL> *)
                     CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          this_01 = (anon_class_24_3_421b894d *)&stack0xffffffffffffff20;
          digits._M_extent._M_extent_value = in_RDX._M_extent_value;
          digits._M_ptr = in_RSI;
          SVInt::fromDigits(in_stack_ffffffffffffff34,in_stack_ffffffffffffff33,
                            (bool)in_stack_ffffffffffffff32,(bool)in_stack_ffffffffffffff31,digits);
          finishValue::anon_class_16_2_3c4fafbd::operator()
                    (in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                     (SVInt *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
          TVar7 = finishValue(slang::parsing::Token,bool,bool)::$_0::operator()
                            (this_01,(SVInt *)CONCAT44(uVar6,uVar3));
          SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
          return TVar7;
        }
        if (0xffffff < local_bc) {
          local_bc = 0xffffff;
          location._4_4_ = in_stack_fffffffffffffe6c;
          location._0_4_ = in_stack_fffffffffffffe68;
          addDiag(in_stack_fffffffffffffe60,in_stack_fffffffffffffe74,location);
          Diagnostic::operator<<<int>
                    ((Diagnostic *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                     in_stack_fffffffffffffe6c);
        }
        in_stack_ffffffffffffff34 = 0x20;
        puVar5 = std::max<unsigned_int>((uint *)&stack0xffffffffffffff34,&local_bc);
        *in_RDI = *puVar5;
      }
    }
    uVar6 = (uint)*(byte *)((long)in_RDI + 0x19);
    uVar3 = (uint)(byte)in_RDI[6];
    std::span<const_slang::logic_t,_18446744073709551615UL>::
    span<slang::SmallVector<slang::logic_t,_40UL>_&>
              ((span<const_slang::logic_t,_18446744073709551615UL> *)
               (ulong)CONCAT14(*(byte *)((long)in_RDI + 0x19),uVar3),
               (SmallVector<slang::logic_t,_40UL> *)
               CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    digits_00._M_extent._M_extent_value = in_RDX._M_extent_value;
    digits_00._M_ptr = in_RSI;
    SVInt::fromDigits(in_stack_ffffffffffffff34,in_stack_ffffffffffffff33,
                      (bool)in_stack_ffffffffffffff32,(bool)in_stack_ffffffffffffff31,digits_00);
    local_10 = finishValue(slang::parsing::Token,bool,bool)::$_0::operator()
                         (in_stack_fffffffffffffec0,
                          (SVInt *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    SVInt::~SVInt((SVInt *)CONCAT44(uVar6,uVar3));
  }
  return local_10;
}

Assistant:

Token NumberParser::finishValue(Token firstToken, bool singleToken, bool isNegated) {
    auto createResult = [&](auto&& val) {
        return Token(alloc, TokenKind::IntegerLiteral, firstToken.trivia(),
                     singleToken ? firstToken.rawText() : toStringView(text.copy(alloc)),
                     firstLocation, std::forward<decltype(val)>(val));
    };

    auto checkOverflow = [&](bitwidth_t computedWidth, const SVInt& value) {
        // Special case to avoid the warning when we have a minus operator preceeding
        // a min value signed negative integer, with no unknowns.
        if (isNegated && signFlag && !hasUnknown && computedWidth == sizeBits + 1 &&
            value.isNegative() && value.countOnes() == 1) {
            return;
        }

        addDiag(diag::VectorLiteralOverflow, firstLocation) << computedWidth;
    };

    if (!valid)
        return createResult(0);

    if (literalBase == LiteralBase::Decimal && !hasUnknown) {
        // If we added an x or z, we will fall through to the general handler below.
        // Otherwise, optimize for this case by reusing the integer value already
        // computed by the token itself.
        bitwidth_t width = decimalValue.getBitWidth();
        if (signFlag) {
            width++;
            decimalValue = decimalValue.resize(width);
        }

        // If no size was specified, just return the value as-is. Otherwise,
        // resize it to match the desired size. Warn if that will truncate.
        SVInt result;
        if (!sizeBits) {
            // Unsized numbers are required to be at least 32 bits by the spec.
            if (width < 32)
                result = decimalValue.resize(32);
            else
                result = std::move(decimalValue);
        }
        else if (width != sizeBits) {
            result = decimalValue.resize(sizeBits);
            if (width > sizeBits)
                checkOverflow(width, result);
        }
        else {
            result = std::move(decimalValue);
        }

        result.setSigned(signFlag);
        return createResult(std::move(result));
    }

    if (digits.empty()) {
        digits.push_back(logic_t(0));
    }
    else if (literalBase != LiteralBase::Decimal) {
        uint32_t multiplier = 0;
        switch (literalBase) {
            case LiteralBase::Binary:
                multiplier = 1;
                break;
            case LiteralBase::Octal:
                multiplier = 3;
                break;
            case LiteralBase::Hex:
                multiplier = 4;
                break;
            default:
                SLANG_UNREACHABLE;
        }

        // All of the digits in the number require `multiplier` bits, except for
        // possibly the first (leading) digit. This one has leading zeros in it,
        // so only requires clog2(d+1) bits.
        bitwidth_t bits = 0;
        if (digits.size() > 1)
            bits = bitwidth_t(digits.size() - 1) * multiplier;

        // If the leading digit is unknown however, allow any size.
        if (!digits[0].isUnknown())
            bits += (bitwidth_t)std::bit_width(digits[0].value);

        if (bits > sizeBits) {
            if (sizeBits == 0) {
                if (bits > SVInt::MAX_BITS) {
                    bits = SVInt::MAX_BITS;
                    addDiag(diag::LiteralSizeTooLarge, firstLocation) << (int)SVInt::MAX_BITS;
                }

                sizeBits = std::max(32u, bits);
            }
            else {
                auto result = SVInt::fromDigits(sizeBits, literalBase, signFlag, hasUnknown,
                                                digits);
                checkOverflow(bits, result);
                return createResult(std::move(result));
            }
        }
    }

    return createResult(
        SVInt::fromDigits(sizeBits ? sizeBits : 32, literalBase, signFlag, hasUnknown, digits));
}